

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O3

void TestSplitTwice(void)

{
  size_t sVar1;
  size_t sVar2;
  OutputBuffer buf1;
  string msg1;
  char buffer [6];
  shared_count sStack_3a8;
  undefined1 local_3a0 [16];
  undefined8 *local_390;
  char *local_388;
  size_type local_380;
  size_type local_378;
  size_type *local_370;
  size_type *local_368;
  const_string local_360;
  istream is;
  istream is2;
  
  is2.super_istream._vptr_basic_istream = (_func_int **)anon_var_dwarf_a2e99;
  is2.super_istream._M_gcount =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
       + 0x6d;
  is2.super_istream._16_8_ = 0x32f;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)&is2);
  boost::unit_test::anon_unknown_0::s_log_impl();
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_entry_data.m_level = log_messages;
  msg1._M_dataplus._M_p._0_1_ = 1;
  is.super_istream._M_gcount = is.super_istream._M_gcount & 0xffffffffffffff00;
  is.super_istream._vptr_basic_istream = (_func_int **)&PTR__lazy_ostream_001dcbb0;
  is.super_istream._16_8_ = &boost::unit_test::lazy_ostream::inst;
  is.super_istream._24_8_ = anon_var_dwarf_a46e0;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,(lazy_ostream *)&is);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&msg1);
  makeString_abi_cxx11_(&msg1,0x1e);
  avro::OutputBuffer::OutputBuffer(&buf1,0);
  avro::detail::BufferImpl::writeTo
            (buf1.pimpl_.px,
             (data_type *)CONCAT71(msg1._M_dataplus._M_p._1_7_,msg1._M_dataplus._M_p._0_1_),
             msg1._M_string_length);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x336;
  local_3a0[8] = false;
  local_3a0._0_8_ = &PTR__lazy_ostream_001dc7b0;
  local_390 = &boost::unit_test::lazy_ostream::inst;
  local_388 = "";
  local_378 = (buf1.pimpl_.px)->size_;
  local_368 = &local_378;
  local_370 = &local_380;
  buffer[0] = local_378 == msg1._M_string_length;
  local_380 = msg1._M_string_length;
  sStack_3a8.pi_ = (sp_counted_base *)0x0;
  local_360.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_360.m_end = "";
  is.super_istream._24_8_ = &local_368;
  is.super_istream._M_gcount = is.super_istream._M_gcount & 0xffffffffffffff00;
  is.super_istream._vptr_basic_istream = (_func_int **)&PTR__lazy_ostream_001dc7f0;
  is.super_istream._16_8_ = &boost::unit_test::lazy_ostream::inst;
  is2.super_istream._24_8_ = &local_370;
  is2.super_istream._M_gcount = is2.super_istream._M_gcount & 0xffffffffffffff00;
  is2.super_istream._vptr_basic_istream = (_func_int **)&PTR__lazy_ostream_001dc7f0;
  is2.super_istream._16_8_ = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)buffer,(lazy_ostream *)local_3a0,&local_360,0x336,CHECK,CHECK_EQUAL
             ,2,"buf1.size()",(lazy_ostream *)&is,"msg1.size()",(begin *)&is2);
  boost::detail::shared_count::~shared_count(&sStack_3a8);
  avro::InputBuffer::InputBuffer((InputBuffer *)&is,&buf1);
  printBuffer((InputBuffer *)&is);
  boost::detail::shared_count::~shared_count((shared_count *)&is.super_istream._M_gcount);
  avro::istream::istream(&is,&buf1);
  std::istream::readsome((char *)&is,(long)buffer);
  buffer[5] = '\0';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"buffer =",8);
  sVar1 = strlen(buffer);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,buffer,sVar1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  sVar2 = std::istream::tellg();
  avro::OutputBuffer::discardData(&buf1,sVar2);
  avro::InputBuffer::InputBuffer((InputBuffer *)&is2,&buf1);
  printBuffer((InputBuffer *)&is2);
  boost::detail::shared_count::~shared_count((shared_count *)&is2.super_istream._M_gcount);
  avro::istream::istream(&is2,&buf1);
  std::istream::seekg(&is2,0xf,0);
  sVar2 = std::istream::tellg();
  avro::OutputBuffer::discardData(&buf1,sVar2);
  avro::InputBuffer::InputBuffer((InputBuffer *)local_3a0,&buf1);
  printBuffer((InputBuffer *)local_3a0);
  boost::detail::shared_count::~shared_count((shared_count *)(local_3a0 + 8));
  is2.super_istream._vptr_basic_istream = (_func_int **)(avro::istream::vtable + 0x18);
  is2.super_istream._136_8_ = 0x1db690;
  is2.super_istream._16_8_ = &PTR__istreambuf_001db718;
  boost::detail::shared_count::~shared_count((shared_count *)&is2.super_istream.field_0x58);
  is2.super_istream._16_8_ = sysconf;
  std::locale::~locale((locale *)&is2.super_istream.field_0x48);
  is2.super_istream._vptr_basic_istream =
       (_func_int **)(std::istream-in-avro::istream::construction_vtable + 0x18);
  is2.super_istream._136_8_ = 0x1db6e0;
  is2.super_istream._M_gcount = 0;
  std::ios_base::~ios_base((ios_base *)&is2.super_istream.field_0x88);
  is.super_istream._vptr_basic_istream = (_func_int **)(avro::istream::vtable + 0x18);
  is.super_istream._136_8_ = 0x1db690;
  is.super_istream._16_8_ = &PTR__istreambuf_001db718;
  boost::detail::shared_count::~shared_count((shared_count *)&is.super_istream.field_0x58);
  is.super_istream._16_8_ = sysconf;
  std::locale::~locale((locale *)&is.super_istream.field_0x48);
  is.super_istream._vptr_basic_istream =
       (_func_int **)(std::istream-in-avro::istream::construction_vtable + 0x18);
  is.super_istream._136_8_ = 0x1db6e0;
  is.super_istream._M_gcount = 0;
  std::ios_base::~ios_base((ios_base *)&is.super_istream.field_0x88);
  boost::detail::shared_count::~shared_count(&buf1.pimpl_.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(msg1._M_dataplus._M_p._1_7_,msg1._M_dataplus._M_p._0_1_) != &msg1.field_2) {
    operator_delete((undefined1 *)CONCAT71(msg1._M_dataplus._M_p._1_7_,msg1._M_dataplus._M_p._0_1_),
                    msg1.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TestSplitTwice() 
{
    BOOST_TEST_MESSAGE( "TestSplitTwice");
    {
        const std::string msg1 = makeString(30);

        avro::OutputBuffer buf1;
        buf1.writeTo(msg1.c_str(), msg1.size());

        BOOST_CHECK_EQUAL(buf1.size(), msg1.size());

        printBuffer(buf1);

        avro::istream is(buf1);
        char buffer[6];
        is.readsome(buffer, 5);
        buffer[5] = 0;
        std::cout << "buffer =" << buffer << std::endl;
        
        buf1.discardData(static_cast<size_t>(is.tellg()));
        printBuffer(buf1);

        avro::istream is2(buf1);
        is2.seekg(15);

        buf1.discardData(static_cast<size_t>(is2.tellg()));
        printBuffer(buf1);
    }
}